

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void ucnv_cbFromUWriteUChars_63
               (UConverterFromUnicodeArgs *args,UChar **source,UChar *sourceLimit,
               int32_t offsetIndex,UErrorCode *err)

{
  char *pcVar1;
  UConverter *cnv;
  int32_t *piVar2;
  char *pcVar3;
  UErrorCode err2;
  UChar *local_40;
  char *newTarget;
  
  if (U_ZERO_ERROR < *err) {
    return;
  }
  pcVar3 = args->target;
  local_40 = sourceLimit;
  ucnv_fromUnicode_63(args->converter,&args->target,args->targetLimit,source,sourceLimit,
                      (int32_t *)0x0,'\0',err);
  piVar2 = args->offsets;
  if ((piVar2 != (int32_t *)0x0) && (pcVar1 = args->target, pcVar1 != pcVar3)) {
    do {
      *piVar2 = offsetIndex;
      piVar2 = piVar2 + 1;
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != pcVar1);
    args->offsets = piVar2;
  }
  if (*err == U_BUFFER_OVERFLOW_ERROR) {
    err2 = U_ZERO_ERROR;
    cnv = args->converter;
    newTarget = (char *)(cnv->charErrorBuffer + cnv->charErrorBufferLength);
    if ((long)cnv->charErrorBufferLength < 0x20) {
      cnv->charErrorBufferLength = '\0';
      ucnv_fromUnicode_63(cnv,&newTarget,(char *)cnv->subUChars,source,local_40,(int32_t *)0x0,'\0',
                          &err2);
      args->converter->charErrorBufferLength = ((char)newTarget - (char)args->converter) + -0x68;
      if ((newTarget < cnv->subUChars) && (err2 != U_BUFFER_OVERFLOW_ERROR)) {
        return;
      }
    }
    *err = U_INTERNAL_PROGRAM_ERROR;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }